

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_beam.cpp
# Opt level: O2

bool CleanProfileSegment(ON_Curve *curve)

{
  bool bVar1;
  int iVar2;
  ON_NurbsCurve *this;
  
  this = ON_NurbsCurve::Cast((ON_Object *)curve);
  if (this == (ON_NurbsCurve *)0x0) {
    bVar1 = true;
  }
  else {
    ON_NurbsCurve::RemoveSingularSpans(this);
    bVar1 = false;
    iVar2 = (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[6])(this);
    if ((char)iVar2 != '\0') {
      bVar1 = ON_NurbsCurve::SpanIsSingular(this,0);
      bVar1 = !bVar1;
    }
  }
  return bVar1;
}

Assistant:

static bool CleanProfileSegment( ON_Curve* curve )
{
  ON_NurbsCurve* nurbs_curve = ON_NurbsCurve::Cast(curve);
  if ( nurbs_curve )
  {
    nurbs_curve->RemoveSingularSpans();
    return ( nurbs_curve->IsValid() && false == nurbs_curve->SpanIsSingular(0) );
  }
  
  return true;
}